

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::Colour::use(Code _colourCode)

{
  bool bVar1;
  int iVar2;
  IColourImpl *local_30;
  Code _colourCode_local;
  
  if (use(Catch::Colour::Code)::impl == '\0') {
    iVar2 = __cxa_guard_acquire(&use(Catch::Colour::Code)::impl);
    if (iVar2 != 0) {
      bVar1 = isDebuggerActive();
      if (bVar1) {
        local_30 = anon_unknown_22::NoColourImpl::instance();
      }
      else {
        local_30 = anon_unknown_22::platformColourInstance();
      }
      use::impl = local_30;
      __cxa_guard_release(&use(Catch::Colour::Code)::impl);
    }
  }
  (**(code **)(*(long *)use::impl + 0x10))(use::impl,_colourCode);
  return;
}

Assistant:

void Colour::use( Code _colourCode ) {
        static IColourImpl* impl = isDebuggerActive()
            ? NoColourImpl::instance()
            : platformColourInstance();
        impl->use( _colourCode );
    }